

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedDirectory.cpp
# Opt level: O0

bool __thiscall SharedDirectory::can_create_file(SharedDirectory *this,uint64_t size,string *name)

{
  bool bVar1;
  uint uVar2;
  bool local_a1;
  _Self local_a0;
  _Self local_98;
  _Self local_90;
  _Self local_88;
  byte local_7d;
  byte local_69;
  string local_68;
  path local_48;
  string *local_28;
  string *name_local;
  uint64_t size_local;
  SharedDirectory *this_local;
  
  local_69 = 0;
  local_7d = 0;
  local_a1 = false;
  local_28 = name;
  name_local = (string *)size;
  size_local = (uint64_t)this;
  if ((size <= this->remaining_space) && (local_a1 = false, size != 0)) {
    uVar2 = boost::filesystem::portable_name((string *)name);
    local_a1 = false;
    if ((uVar2 & 1) != 0) {
      std::__cxx11::string::string((string *)&local_68,(string *)local_28);
      local_69 = 1;
      path_in_dir(&local_48,this,&local_68);
      local_7d = 1;
      bVar1 = boost::filesystem::exists(&local_48);
      local_a1 = false;
      if (!bVar1) {
        local_88._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::find(&this->indexed_files,local_28);
        local_90._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
             ::end(&this->indexed_files);
        bVar1 = std::operator==(&local_88,&local_90);
        local_a1 = false;
        if (bVar1) {
          local_98._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               ::find(&this->pending_files,local_28);
          local_a0._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               ::end(&this->pending_files);
          local_a1 = std::operator==(&local_98,&local_a0);
        }
      }
    }
  }
  this_local._7_1_ = local_a1;
  if ((local_7d & 1) != 0) {
    boost::filesystem::path::~path(&local_48);
  }
  if ((local_69 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_68);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool SharedDirectory::can_create_file(uint64_t size, const std::string &name) {
  return size <= this->remaining_space && size > 0
      && portable_name(name)
      && !exists(path_in_dir(name))
      && (indexed_files.find(name) == indexed_files.end())
      && (pending_files.find(name) == pending_files.end());
}